

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O2

String * __thiscall CommandLine::describeOptions(String *__return_storage_ptr__,CommandLine *this)

{
  _Elt_pointer ppCVar1;
  CommandLineOption *pCVar2;
  List<CommandLineOption_*> *this_00;
  bool bVar3;
  String *line_1;
  size_type sVar4;
  size_type sVar5;
  String *pSVar6;
  CommandLineOption **ppCVar7;
  int iVar8;
  int iVar9;
  _Elt_pointer ppCVar10;
  _Elt_pointer ppCVar11;
  String description;
  String *result;
  StringList lines;
  StringList extralines;
  _Map_pointer local_1b0;
  String local_1a8;
  _Map_pointer local_188;
  String *local_180;
  List<CommandLineOption_*> *local_178;
  _Deque_base<String,_std::allocator<String>_> local_170;
  String local_120;
  String local_100;
  string local_e0 [32];
  _Deque_base<String,_std::allocator<String>_> local_c0;
  string local_70 [32];
  string local_50 [32];
  
  local_180 = __return_storage_ptr__;
  std::_Deque_base<String,_std::allocator<String>_>::_Deque_base(&local_170);
  ppCVar10 = (this->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  ppCVar11 = (this->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_188 = (this->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  ppCVar1 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  local_178 = &this->_options;
  while (this_00 = local_178, ppCVar10 != ppCVar1) {
    pCVar2 = *ppCVar10;
    String::String((String *)&local_c0,"  ");
    if (pCVar2->_shortform == '\0') {
      std::__cxx11::string::append((char *)&local_c0);
    }
    else {
      local_1a8._string._M_dataplus._M_p = (pointer)&local_1a8._string.field_2;
      local_1a8._string.field_2._M_local_buf[0] = '-';
      local_1a8._string.field_2._M_allocated_capacity._2_2_ = 0;
      local_1a8._string._M_string_length = 3;
      local_1a8._string.field_2._M_local_buf[1] = pCVar2->_shortform;
      std::__cxx11::string::string(local_e0,(string *)&local_1a8);
      std::__cxx11::string::append((char *)&local_c0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::append((char *)&local_c0);
    if (*(pCVar2->_longform)._string._M_dataplus._M_p != '\0') {
      ::operator+(&local_100,"--",&pCVar2->_longform);
      std::__cxx11::string::append((char *)&local_c0);
      std::__cxx11::string::~string((string *)&local_100);
      (*pCVar2->_vptr_CommandLineOption[3])((string *)&local_1a8,pCVar2);
      if (*local_1a8._string._M_dataplus._M_p != '\0') {
        ::operator+(&local_120,"=",&local_1a8);
        std::__cxx11::string::append((char *)&local_c0);
        std::__cxx11::string::~string((string *)&local_120);
      }
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    List<String>::append((List<String> *)&local_170,(String *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    ppCVar10 = ppCVar10 + 1;
    if (ppCVar10 == ppCVar11) {
      ppCVar10 = local_188[1];
      local_188 = local_188 + 1;
      ppCVar11 = ppCVar10 + 0x40;
    }
  }
  iVar9 = 0;
  while (local_170._M_impl.super__Deque_impl_data._M_start._M_cur !=
         local_170._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    iVar8 = (int)((local_170._M_impl.super__Deque_impl_data._M_start._M_cur)->_string).
                 _M_string_length;
    if (iVar9 <= iVar8) {
      iVar9 = iVar8;
    }
    local_170._M_impl.super__Deque_impl_data._M_start._M_cur =
         local_170._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    if (local_170._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_170._M_impl.super__Deque_impl_data._M_start._M_last) {
      local_170._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_170._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_170._M_impl.super__Deque_impl_data._M_start._M_node =
           local_170._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      local_170._M_impl.super__Deque_impl_data._M_start._M_last =
           local_170._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
    }
  }
  sVar4 = std::deque<String,_std::allocator<String>_>::size
                    ((deque<String,_std::allocator<String>_> *)&local_170);
  sVar5 = std::deque<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>::size
                    (&this_00->_deque);
  if ((int)sVar4 != (int)sVar5) {
    sVar4 = std::deque<String,_std::allocator<String>_>::size
                      ((deque<String,_std::allocator<String>_> *)&local_170);
    local_c0._M_impl.super__Deque_impl_data._M_map._0_4_ = (undefined4)sVar4;
    sVar4 = std::deque<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>::size
                      (&this_00->_deque);
    local_1a8._string._M_dataplus._M_p._0_4_ = (int)sVar4;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:176: lines.size() (%1) does not equal _options.size() (%2)"
                   ,(int *)&local_c0,(int *)&local_1a8);
  }
  iVar8 = 0;
  while( true ) {
    sVar4 = std::deque<String,_std::allocator<String>_>::size
                      ((deque<String,_std::allocator<String>_> *)&local_170);
    if ((int)sVar4 <= iVar8) break;
    while( true ) {
      pSVar6 = List<String>::operator[]((List<String> *)&local_170,iVar8);
      if (iVar9 + 2 <= (int)(pSVar6->_string)._M_string_length) break;
      pSVar6 = List<String>::operator[]((List<String> *)&local_170,iVar8);
      std::__cxx11::string::append((char *)pSVar6);
    }
    ppCVar7 = List<CommandLineOption_*>::operator[](this_00,iVar8);
    std::__cxx11::string::string(local_70,(string *)&(*ppCVar7)->_description);
    pSVar6 = List<String>::operator[]((List<String> *)&local_170,iVar8);
    std::__cxx11::string::append((char *)pSVar6);
    std::__cxx11::string::~string(local_70);
    iVar8 = iVar8 + 1;
  }
  std::_Deque_base<String,_std::allocator<String>_>::_Deque_base(&local_c0);
  ppCVar10 = (this_00->_deque).
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  ppCVar11 = (this_00->_deque).
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_1b0 = (this_00->_deque).
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  ppCVar1 = (this_00->_deque).
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppCVar10 != ppCVar1) {
    (*(*ppCVar10)->_vptr_CommandLineOption[4])((string *)&local_1a8);
    if (*local_1a8._string._M_dataplus._M_p != '\0') {
      bVar3 = List<String>::isEmpty((List<String> *)&local_c0);
      if (bVar3) {
        String::String((String *)local_50,"");
        List<String>::append((List<String> *)&local_c0,(String *)local_50);
        std::__cxx11::string::~string(local_50);
      }
      List<String>::append((List<String> *)&local_c0,&local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_1a8);
    ppCVar10 = ppCVar10 + 1;
    if (ppCVar10 == ppCVar11) {
      ppCVar10 = local_1b0[1];
      local_1b0 = local_1b0 + 1;
      ppCVar11 = ppCVar10 + 0x40;
    }
  }
  List<String>::merge((List<String> *)&local_170,(List<String> *)&local_c0);
  String::String(&local_1a8,"\n");
  pSVar6 = local_180;
  StringList::join(local_180,(StringList *)&local_170,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::deque<String,_std::allocator<String>_>::~deque
            ((deque<String,_std::allocator<String>_> *)&local_c0);
  std::deque<String,_std::allocator<String>_>::~deque
            ((deque<String,_std::allocator<String>_> *)&local_170);
  return pSVar6;
}

Assistant:

String CommandLine::describeOptions() const
{
	StringList lines;

	for (CommandLineOption* option : _options)
	{
		String line ("  ");

		if (option->shortform() != '\0')
			line += String ({'-', option->shortform(), '\0'});
		else
			line += "  ";

		line += "  ";

		if (not option->longform().isEmpty())
		{
			line += "--" + option->longform();
			String description (option->describeArgument());

			if (not description.isEmpty())
				line += "=" + description;
		}

		lines << line;
	}

	int maxlength (0);

	for (String& line : lines)
		maxlength = max (maxlength, line.length());

	maxlength += 2;
	ASSERT_EQ (lines.size(), _options.size());

	for (int i = 0; i < lines.size(); ++i)
	{
		while (lines[i].length() < maxlength)
			lines[i] += " ";

		lines[i] += _options[i]->description();
	}

	StringList extralines;

	for (CommandLineOption* option : _options)
	{
		String extradata = option->describeExtra();

		if (not extradata.isEmpty())
		{
			if (extralines.isEmpty())
				extralines << "";

			extralines << extradata;
		}
	}

	lines.merge (extralines);
	String result (lines.join ("\n"));
	return result;
}